

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuDefs.cpp
# Opt level: O0

void __thiscall
tcu::TestException::TestException
          (TestException *this,char *message,char *expr,char *file,int line,qpTestResult result)

{
  string local_50;
  qpTestResult local_30;
  int local_2c;
  qpTestResult result_local;
  int line_local;
  char *file_local;
  char *expr_local;
  char *message_local;
  TestException *this_local;
  
  local_30 = result;
  local_2c = line;
  _result_local = file;
  file_local = expr;
  expr_local = message;
  message_local = (char *)this;
  formatError_abi_cxx11_(&local_50,(tcu *)message,expr,file,(char *)(ulong)(uint)line,result);
  Exception::Exception(&this->super_Exception,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&this->super_Exception = &PTR__TestException_0025c9c8;
  this->m_result = local_30;
  return;
}

Assistant:

TestException::TestException (const char* message, const char* expr, const char* file, int line, qpTestResult result)
	: Exception	(formatError(message, expr, file, line))
	, m_result	(result)
{
}